

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O1

ushort __thiscall
Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::AddDisposedObjectFreeBitVector
          (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this,
          SmallHeapBlockBitVector *free)

{
  FreeObject *pFVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  undefined4 *puVar5;
  FreeObject *pFVar6;
  uint bitIndex;
  ushort uVar7;
  FreeObject *this_00;
  
  this_00 = this->disposedObjectList;
  if (this_00 == (FreeObject *)0x0) {
    uVar7 = 0;
  }
  else {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar7 = 0;
    do {
      if (((ulong)this_00 & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                           "HeapInfo::IsAlignedAddress(objectAddress)");
        if (!bVar3) goto LAB_0073ab4c;
        *puVar5 = 0;
      }
      bitIndex = (uint)((ulong)this_00 >> 4) & 0xff;
      bVar3 = SmallHeapBlockT<SmallAllocationBlockAttributes>::IsValidBitIndex
                        ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this,bitIndex);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                           ,0x21f,"(this->IsValidBitIndex(bitIndex))",
                           "this->IsValidBitIndex(bitIndex)");
        if (!bVar3) goto LAB_0073ab4c;
        *puVar5 = 0;
      }
      BVar4 = BVStatic<256UL>::Test
                        (&(this->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                          super_SmallHeapBlockT<SmallAllocationBlockAttributes>.debugFreeBits,
                         bitIndex);
      if (BVar4 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                           ,0x222,"(!this->GetDebugFreeBitVector()->Test(bitIndex))",
                           "!this->GetDebugFreeBitVector()->Test(bitIndex)");
        if (!bVar3) {
LAB_0073ab4c:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      BVStatic<256UL>::Set(free,bitIndex);
      pFVar1 = this->disposedObjectListTail;
      pFVar6 = this_00;
      if (this_00 != pFVar1) {
        pFVar6 = FreeObject::GetNext(this_00);
      }
      uVar7 = uVar7 + 1;
      bVar3 = this_00 != pFVar1;
      this_00 = pFVar6;
    } while (bVar3);
  }
  return uVar7;
}

Assistant:

ushort
SmallFinalizableHeapBlockT<TBlockAttributes>::AddDisposedObjectFreeBitVector(SmallHeapBlockBitVector * free)
{
    // all the finalized object are considered freed, but not allocable yet
    ushort freeCount = 0;
    FreeObject * freeObject = this->disposedObjectList;

    if (freeObject != nullptr)
    {
        while (true)
        {
            uint bitIndex = this->GetAddressBitIndex(freeObject);
            Assert(this->IsValidBitIndex(bitIndex));

            // not allocable yet
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));

            // but in the free list to mark can skip scanning the object
            free->Set(bitIndex);
            freeCount++;

            if (freeObject == this->disposedObjectListTail)
            {
                break;
            }
            freeObject = freeObject->GetNext();
        }
    }
    return freeCount;
}